

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetools.cpp
# Opt level: O1

int32_t whichFileModTimeIsLater(char *file1,char *file2)

{
  int iVar1;
  double dVar2;
  stat stbuf2;
  stat stbuf1;
  stat local_130;
  stat local_a0;
  
  iVar1 = stat(file1,&local_a0);
  if ((iVar1 != 0) || (iVar1 = stat(file2,&local_130), iVar1 != 0)) {
    fprintf(_stderr,"Unable to get stats from file: %s or %s\n",file1,file2);
    return -1;
  }
  dVar2 = difftime(local_a0.st_mtim.tv_sec,local_130.st_mtim.tv_sec);
  if (dVar2 < 0.0) {
    return 2;
  }
  if (dVar2 <= 0.0) {
    return 0;
  }
  return 1;
}

Assistant:

static int32_t whichFileModTimeIsLater(const char *file1, const char *file2) {
    int32_t result = 0;
    struct stat stbuf1, stbuf2;

    if (stat(file1, &stbuf1) == 0 && stat(file2, &stbuf2) == 0) {
        time_t modtime1, modtime2;
        double diff;

        modtime1 = stbuf1.st_mtime;
        modtime2 = stbuf2.st_mtime;

        diff = difftime(modtime1, modtime2);
        if (diff < 0.0) {
            result = 2;
        } else if (diff > 0.0) {
            result = 1;
        }

    } else {
        fprintf(stderr, "Unable to get stats from file: %s or %s\n", file1, file2);
        result = -1;
    }

    return result;
}